

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFEmbeddedFontWriter.cpp
# Opt level: O0

EStatusCode __thiscall
CFFEmbeddedFontWriter::WriteTopDictSegment
          (CFFEmbeddedFontWriter *this,MyStringBuf *ioTopDictSegment)

{
  unsigned_short uVar1;
  bool bVar2;
  EStatusCode EVar3;
  pointer ppVar4;
  ostream *poVar5;
  LongFilePositionType LVar6;
  byte local_271;
  string local_238 [32];
  stringstream local_218 [8];
  stringstream formatter;
  ostream local_208 [376];
  _Self local_90;
  _Self local_88;
  _Self local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  TopDictInfo *local_68;
  UShortToDictOperandListMap *originalTopDictRef;
  iterator it;
  iterator itROS;
  undefined1 local_40 [8];
  CFFPrimitiveWriter dictPrimitiveWriter;
  OutputStringBufferStream topDictStream;
  MyStringBuf *ioTopDictSegment_local;
  CFFEmbeddedFontWriter *this_local;
  
  OutputStringBufferStream::OutputStringBufferStream
            ((OutputStringBufferStream *)&dictPrimitiveWriter.mInternalState,ioTopDictSegment);
  CFFPrimitiveWriter::CFFPrimitiveWriter((CFFPrimitiveWriter *)local_40,(IByteWriter *)0x0);
  std::
  _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
  ::_Rb_tree_iterator(&it);
  std::
  _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                       *)&originalTopDictRef);
  CFFPrimitiveWriter::SetStream
            ((CFFPrimitiveWriter *)local_40,(IByteWriter *)&dictPrimitiveWriter.mInternalState);
  local_68 = (this->mOpenTypeInput).mCFF.mTopDictIndex;
  local_70 = (_Base_ptr)
             std::
             map<unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
             ::find(&local_68->mTopDict,&scROS);
  it = (iterator)local_70;
  if ((this->mIsCID & 1U) != 0) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
             ::operator->(&it);
    uVar1 = ppVar4->first;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
             ::operator->(&it);
    CFFPrimitiveWriter::WriteDictItems((CFFPrimitiveWriter *)local_40,uVar1,&ppVar4->second);
  }
  local_78 = (_Base_ptr)
             std::
             map<unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
             ::begin(&local_68->mTopDict);
  originalTopDictRef = (UShortToDictOperandListMap *)local_78;
  while( true ) {
    local_80._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
         ::end(&local_68->mTopDict);
    bVar2 = std::operator!=((_Self *)&originalTopDictRef,&local_80);
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                           *)&originalTopDictRef);
    if ((((ppVar4->first != 0xc1e) &&
         (ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                                 *)&originalTopDictRef), ppVar4->first != 0xf)) &&
        (ppVar4 = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                                *)&originalTopDictRef), ppVar4->first != 0x10)) &&
       (((ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                                 *)&originalTopDictRef), ppVar4->first != 0x11 &&
         (ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                                 *)&originalTopDictRef), ppVar4->first != 0x12)) &&
        ((ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                                 *)&originalTopDictRef), ppVar4->first != 0xc24 &&
         (ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                                 *)&originalTopDictRef), ppVar4->first != 0xc25)))))) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                             *)&originalTopDictRef);
      uVar1 = ppVar4->first;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                             *)&originalTopDictRef);
      CFFPrimitiveWriter::WriteDictItems((CFFPrimitiveWriter *)local_40,uVar1,&ppVar4->second);
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>
                  *)&originalTopDictRef);
  }
  local_88._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
       ::find(&local_68->mTopDict,&scEmbeddedPostscript);
  local_90._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
       ::end(&local_68->mTopDict);
  bVar2 = std::operator==(&local_88,&local_90);
  local_271 = 0;
  if (bVar2) {
    local_271 = (this->mOpenTypeInput).mOS2Exists;
  }
  if ((local_271 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&this->mOptionalEmbeddedPostscript,"");
  }
  else {
    std::__cxx11::stringstream::stringstream(local_218);
    poVar5 = std::operator<<(local_208,"/FSType ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->mOpenTypeInput).mOS2.fsType);
    std::operator<<(poVar5," def");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)&this->mOptionalEmbeddedPostscript,local_238);
    std::__cxx11::string::~string(local_238);
    CFFPrimitiveWriter::WriteIntegerOperand
              ((CFFPrimitiveWriter *)local_40,
               (ulong)((this->mOpenTypeInput).mCFF.mStringsCount + 0x187));
    CFFPrimitiveWriter::WriteDictOperator((CFFPrimitiveWriter *)local_40,0xc15);
    std::__cxx11::stringstream::~stringstream(local_218);
  }
  LVar6 = OutputStringBufferStream::GetCurrentPosition
                    ((OutputStringBufferStream *)&dictPrimitiveWriter.mInternalState);
  this->mCharsetPlaceHolderPosition = LVar6;
  CFFPrimitiveWriter::Pad5Bytes((CFFPrimitiveWriter *)local_40);
  CFFPrimitiveWriter::WriteDictOperator((CFFPrimitiveWriter *)local_40,0xf);
  LVar6 = OutputStringBufferStream::GetCurrentPosition
                    ((OutputStringBufferStream *)&dictPrimitiveWriter.mInternalState);
  this->mCharstringsPlaceHolderPosition = LVar6;
  CFFPrimitiveWriter::Pad5Bytes((CFFPrimitiveWriter *)local_40);
  CFFPrimitiveWriter::WriteDictOperator((CFFPrimitiveWriter *)local_40,0x11);
  if (((this->mOpenTypeInput).mCFF.mPrivateDicts)->mPrivateDictStart == 0) {
    this->mPrivatePlaceHolderPosition = 0;
  }
  else {
    LVar6 = OutputStringBufferStream::GetCurrentPosition
                      ((OutputStringBufferStream *)&dictPrimitiveWriter.mInternalState);
    this->mPrivatePlaceHolderPosition = LVar6;
    CFFPrimitiveWriter::Pad5Bytes((CFFPrimitiveWriter *)local_40);
    CFFPrimitiveWriter::Pad5Bytes((CFFPrimitiveWriter *)local_40);
    CFFPrimitiveWriter::WriteDictOperator((CFFPrimitiveWriter *)local_40,0x12);
  }
  if ((this->mIsCID & 1U) == 0) {
    LVar6 = OutputStringBufferStream::GetCurrentPosition
                      ((OutputStringBufferStream *)&dictPrimitiveWriter.mInternalState);
    this->mEncodingPlaceHolderPosition = LVar6;
    CFFPrimitiveWriter::Pad5Bytes((CFFPrimitiveWriter *)local_40);
    CFFPrimitiveWriter::WriteDictOperator((CFFPrimitiveWriter *)local_40,0x10);
    this->mFDArrayPlaceHolderPosition = 0;
    this->mFDSelectPlaceHolderPosition = 0;
  }
  else {
    this->mEncodingPlaceHolderPosition = 0;
    LVar6 = OutputStringBufferStream::GetCurrentPosition
                      ((OutputStringBufferStream *)&dictPrimitiveWriter.mInternalState);
    this->mFDArrayPlaceHolderPosition = LVar6;
    CFFPrimitiveWriter::Pad5Bytes((CFFPrimitiveWriter *)local_40);
    CFFPrimitiveWriter::WriteDictOperator((CFFPrimitiveWriter *)local_40,0xc24);
    LVar6 = OutputStringBufferStream::GetCurrentPosition
                      ((OutputStringBufferStream *)&dictPrimitiveWriter.mInternalState);
    this->mFDSelectPlaceHolderPosition = LVar6;
    CFFPrimitiveWriter::Pad5Bytes((CFFPrimitiveWriter *)local_40);
    CFFPrimitiveWriter::WriteDictOperator((CFFPrimitiveWriter *)local_40,0xc25);
  }
  EVar3 = CFFPrimitiveWriter::GetInternalState((CFFPrimitiveWriter *)local_40);
  CFFPrimitiveWriter::~CFFPrimitiveWriter((CFFPrimitiveWriter *)local_40);
  OutputStringBufferStream::~OutputStringBufferStream
            ((OutputStringBufferStream *)&dictPrimitiveWriter.mInternalState);
  return EVar3;
}

Assistant:

EStatusCode CFFEmbeddedFontWriter::WriteTopDictSegment(MyStringBuf& ioTopDictSegment)
{
	OutputStringBufferStream topDictStream(&ioTopDictSegment);
	CFFPrimitiveWriter dictPrimitiveWriter;
	UShortToDictOperandListMap::iterator itROS;
	UShortToDictOperandListMap::iterator it;
	dictPrimitiveWriter.SetStream(&topDictStream);

	UShortToDictOperandListMap& originalTopDictRef = mOpenTypeInput.mCFF.mTopDictIndex[0].mTopDict;

	itROS = originalTopDictRef.find(scROS);

	 // make sure to write ROS first, if one exists
	if(mIsCID)
		dictPrimitiveWriter.WriteDictItems(itROS->first,itROS->second);

	// write all keys, excluding those that we want to write on our own
	for(it = originalTopDictRef.begin(); it != originalTopDictRef.end();++it)
	{
		if(	it->first != scROS &&
			it->first != scCharset &&
			it->first != scEncoding &&
			it->first != scCharstrings &&
			it->first != scPrivate &&
			it->first != scFDArray &&
			it->first != scFDSelect)
				dictPrimitiveWriter.WriteDictItems(it->first,it->second);
	}
	// check if it had an embedded postscript (which would normally be the FSType implementation).
	// if not...create one to implement the FSType
	if(originalTopDictRef.find(scEmbeddedPostscript) == originalTopDictRef.end() && mOpenTypeInput.mOS2Exists)
	{
		// no need for sophistication here...you can consider this as the only string to be added.
		// so can be sure that its index would be the current count 
		std::stringstream formatter;
		formatter<<"/FSType "<<mOpenTypeInput.mOS2.fsType<<" def";
		mOptionalEmbeddedPostscript = formatter.str();
		dictPrimitiveWriter.WriteIntegerOperand(mOpenTypeInput.mCFF.mStringsCount + N_STD_STRINGS);
		dictPrimitiveWriter.WriteDictOperator(scEmbeddedPostscript);
	}
	else
		mOptionalEmbeddedPostscript = "";

	// now leave placeholders, record their positions
	mCharsetPlaceHolderPosition = topDictStream.GetCurrentPosition();
	dictPrimitiveWriter.Pad5Bytes();
	dictPrimitiveWriter.WriteDictOperator(scCharset);
	mCharstringsPlaceHolderPosition = topDictStream.GetCurrentPosition();
	dictPrimitiveWriter.Pad5Bytes();
	dictPrimitiveWriter.WriteDictOperator(scCharstrings);
	if(mOpenTypeInput.mCFF.mPrivateDicts[0].mPrivateDictStart != 0)
	{
		mPrivatePlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes(); // for private it's two places - size and position
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scPrivate);
	}
	else
	{
		mPrivatePlaceHolderPosition = 0;
	}
	if(mIsCID)
	{
		mEncodingPlaceHolderPosition = 0;
		mFDArrayPlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scFDArray);
		mFDSelectPlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scFDSelect);
	}
	else
	{
		mEncodingPlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scEncoding);
		mFDArrayPlaceHolderPosition = 0;
		mFDSelectPlaceHolderPosition = 0;
	}
	return dictPrimitiveWriter.GetInternalState();
}